

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnSetValidate(XL *out,char *val_path)

{
  XL pvVar1;
  runtime_error *this;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pvVar1 = *out;
  if (*(char *)((long)pvVar1 + 0x1ec) != '\0') {
    std::__cxx11::string::string((string *)local_38,val_path,&local_39);
    std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x108),(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Input for validation type Must equal to train\'s!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

XL_DLL int XLearnSetValidate(XL *out, const char *val_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (!xl->GetHyperParam().from_file){
    throw std::runtime_error("Input for validation type Must equal to train's!");
  }
  xl->GetHyperParam().validate_set_file = std::string(val_path);
  API_END();
}